

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall CP::list<int>::check_pointer(list<int> *this)

{
  size_t sVar1;
  node *pnVar2;
  reference ppnVar3;
  size_type sVar4;
  ostream *poVar5;
  ulong local_a0;
  size_t i_2;
  size_t i_1;
  ulong local_80;
  size_t i;
  node *p;
  set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  s;
  allocator<CP::list<int>::node_*> local_29;
  undefined1 local_28 [8];
  vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> ptr;
  list<int> *this_local;
  
  sVar1 = this->mSize;
  ptr.super__Vector_base<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &this->mHeader;
  std::allocator<CP::list<int>::node_*>::allocator(&local_29);
  std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::vector
            ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)local_28,
             sVar1 + 1,&local_29);
  std::allocator<CP::list<int>::node_*>::~allocator(&local_29);
  std::
  set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  ::set((set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
         *)&p);
  i = (size_t)this->mHeader;
  for (local_80 = 0; local_80 < this->mSize + 1; local_80 = local_80 + 1) {
    std::
    set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
    ::insert((set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
              *)&p,(value_type *)&i);
    sVar1 = i;
    ppnVar3 = std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::operator[]
                        ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)
                         local_28,local_80);
    *ppnVar3 = (value_type)sVar1;
    i = *(size_t *)(i + 0x10);
  }
  sVar4 = std::
          set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
          ::size((set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
                  *)&p);
  if (sVar4 < this->mSize + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: loop detected");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  for (i_2 = 0; i_2 < this->mSize; i_2 = i_2 + 1) {
    ppnVar3 = std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::operator[]
                        ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)
                         local_28,i_2);
    pnVar2 = (*ppnVar3)->next;
    ppnVar3 = std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::operator[]
                        ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)
                         local_28,i_2 + 1);
    if (pnVar2 != *ppnVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: next pointer broken at position ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,i_2);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  for (local_a0 = 1; local_a0 <= this->mSize; local_a0 = local_a0 + 1) {
    ppnVar3 = std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::operator[]
                        ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)
                         local_28,local_a0);
    pnVar2 = (*ppnVar3)->prev;
    ppnVar3 = std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::operator[]
                        ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)
                         local_28,local_a0 - 1);
    if (pnVar2 != *ppnVar3) {
      poVar5 = std::operator<<((ostream *)&std::cout,"ERROR: prev pointer broken at position ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_a0);
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
  }
  std::
  set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
  ::~set((set<CP::list<int>::node_*,_std::less<CP::list<int>::node_*>,_std::allocator<CP::list<int>::node_*>_>
          *)&p);
  std::vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_>::~vector
            ((vector<CP::list<int>::node_*,_std::allocator<CP::list<int>::node_*>_> *)local_28);
  return;
}

Assistant:

void check_pointer() {
      std::vector<node*> ptr(mSize+1);
      std::set<node*> s;
      node* p = mHeader;
      for (size_t i = 0;i < mSize+1;i++) {
        s.insert(p);
        ptr[i] = p;
        p = p->next;
      }

      if (s.size() < mSize+1) {
        std::cout << "ERROR: loop detected" << std::endl;
      }

      //check forward
      for (size_t i = 0;i < mSize;i++) {
        if (ptr[i]->next != ptr[i+1]) {
          std::cout << "ERROR: next pointer broken at position " << i << std::endl;
        }
      }

      //check backward
      for (size_t i = 1;i <= mSize;i++) {
        if (ptr[i]->prev != ptr[i-1]) {
          std::cout << "ERROR: prev pointer broken at position " << i << std::endl;
        }
      }
    }